

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::BeginLoopInst::Exec
          (BeginLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  code *pcVar2;
  bool bVar3;
  Label LVar4;
  LoopInfo *origLoopInfo;
  RestoreLoopCont *this_00;
  undefined4 *puVar5;
  GroupInfo *pGVar6;
  char *pcVar7;
  uint8 *puVar8;
  int groupId;
  
  origLoopInfo = Matcher::LoopIdToLoopInfo
                           (matcher,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId);
  if (((this->super_GreedyMixin).isGreedy == false) &&
     ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.hasOuterLoops == true)) {
    this_00 = (RestoreLoopCont *)
              ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
              Push<UnifiedRegex::RestoreLoopCont>
                        (&contStack->
                          super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    RestoreLoopCont::RestoreLoopCont
              (this_00,(this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.loopId,origLoopInfo,
               matcher);
    Matcher::PushStats(matcher,contStack,input);
  }
  groupId = (this->super_BodyGroupsMixin).minBodyGroupId;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  for (; groupId <= (this->super_BodyGroupsMixin).maxBodyGroupId; groupId = groupId + 1) {
    pGVar6 = Matcher::GroupIdToGroupInfo(matcher,groupId);
    if (pGVar6->length != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xb58,"(matcher.GroupIdToGroupInfo(i)->IsUndefined())",
                         "matcher.GroupIdToGroupInfo(i)->IsUndefined()");
      if (!bVar3) goto LAB_00d4d964;
      *puVar5 = 0;
    }
  }
  origLoopInfo->number = 0;
  origLoopInfo->startInputOffset = *inputOffset;
  if ((this->super_BeginLoopMixin).super_BeginLoopBasicsMixin.repeats.lower == 0) {
    if ((this->super_GreedyMixin).isGreedy == true) {
      pcVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
               Push<UnifiedRegex::ResumeCont>
                         (&contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      CVar1 = *inputOffset;
      LVar4 = (this->super_BeginLoopMixin).exitLabel;
      pcVar7[8] = '\0';
      *(undefined ***)pcVar7 = &PTR_Print_013e01e8;
      *(CharCount *)(pcVar7 + 0xc) = CVar1;
      *(Label *)(pcVar7 + 0x10) = LVar4;
      puVar8 = *instPointer + 0x1c;
    }
    else {
      if ((BeginLoopInst *)*instPointer != this) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                           ,0xb6a,"(instPointer == (uint8*)this)","instPointer == (uint8*)this");
        if (!bVar3) {
LAB_00d4d964:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pcVar7 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
               Push<UnifiedRegex::RepeatLoopCont>
                         (&contStack->
                           super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
      LVar4 = Matcher::InstPointerToLabel(matcher,*instPointer);
      CVar1 = *inputOffset;
      pcVar7[8] = '\x05';
      *(undefined ***)pcVar7 = &PTR_Print_013e02a8;
      *(Label *)(pcVar7 + 0xc) = LVar4;
      *(CharCount *)(pcVar7 + 0x10) = CVar1;
      puVar8 = Matcher::LabelToInstPointer(matcher,(this->super_BeginLoopMixin).exitLabel);
    }
    *instPointer = puVar8;
    Matcher::PushStats(matcher,contStack,input);
  }
  else {
    *instPointer = *instPointer + 0x1c;
  }
  return false;
}

Assistant:

inline bool BeginLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(loopId);

        // If loop has outer loops, the continuation stack may have choicepoints from an earlier "run" of this loop
        // which, when backtracked to, may expect the loopInfo state to be as it was at the time the choicepoint was
        // pushed.
        //  - If the loop is greedy with deterministic body, there may be Resumes into the follow of the loop, but
        //    they won't look at the loopInfo state so there's nothing to do.
        //  - If the loop is greedy, or if it is non-greedy with lower > 0, AND it has a non-deterministic body,
        //    we may have Resume entries which will resume inside the loop body, which may then run to a
        //    RepeatLoop, which will then look at the loopInfo state. However, each iteration is protected by
        //    a RestoreLoop by RepeatLoopInst below. (****)
        //  - If the loop is non-greedy there may be a RepeatLoop on the stack, so we must restore the loopInfo
        //    state before backtracking to it.
        if (!isGreedy && hasOuterLoops)
        {
            PUSH(contStack, RestoreLoopCont, loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        // The loop body must always begin with empty inner groups
        //  - if the loop is not in an outer they will be empty due to the reset when the match began
        //  - if the loop is in an outer loop, they will have been reset by the outer loop's RepeatLoop instruction
#if DBG
        for (int i = minBodyGroupId; i <= maxBodyGroupId; i++)
        {
            Assert(matcher.GroupIdToGroupInfo(i)->IsUndefined());
        }
#endif

        loopInfo->number = 0;
        loopInfo->startInputOffset = inputOffset;

        if (repeats.lower == 0)
        {
            if (isGreedy)
            {
                // CHOICEPOINT: Try one iteration of body, if backtrack continue from here with no iterations
                PUSH(contStack, ResumeCont, inputOffset, exitLabel);
                instPointer += sizeof(*this);
            }
            else
            {
                // CHOICEPOINT: Try no iterations of body, if backtrack do one iteration of body from here
                Assert(instPointer == (uint8*)this);
                PUSH(contStack, RepeatLoopCont, matcher.InstPointerToLabel(instPointer), inputOffset);
                instPointer = matcher.LabelToInstPointer(exitLabel);
            }
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }
        else
        {
            // Must match minimum iterations, so continue to loop body
            instPointer += sizeof(*this);
        }

        return false;
    }